

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O2

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::UpperInclusiveBetweenOperator,false,false,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  interval_t upper;
  interval_t input;
  interval_t lower;
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong row_idx;
  ulong row_idx_00;
  idx_t i;
  ulong uVar4;
  long lVar5;
  undefined8 in_stack_ffffffffffffff98;
  
  lVar5 = 0;
  for (uVar4 = 0; count != uVar4; uVar4 = uVar4 + 1) {
    uVar3 = uVar4;
    if (result_sel->sel_vector != (sel_t *)0x0) {
      uVar3 = (ulong)result_sel->sel_vector[uVar4];
    }
    uVar2 = uVar4;
    if (asel->sel_vector != (sel_t *)0x0) {
      uVar2 = (ulong)asel->sel_vector[uVar4];
    }
    row_idx = uVar4;
    if (bsel->sel_vector != (sel_t *)0x0) {
      row_idx = (ulong)bsel->sel_vector[uVar4];
    }
    row_idx_00 = uVar4;
    if (csel->sel_vector != (sel_t *)0x0) {
      row_idx_00 = (ulong)csel->sel_vector[uVar4];
    }
    bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&avalidity->super_TemplatedValidityMask<unsigned_long>,uVar2);
    uVar2 = 1;
    if (bVar1) {
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        (&bvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx);
      uVar2 = 1;
      if (bVar1) {
        bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                          (&cvalidity->super_TemplatedValidityMask<unsigned_long>,row_idx_00);
        uVar2 = 1;
        if (bVar1) {
          input.micros = (int64_t)bdata;
          input._0_8_ = adata;
          lower.micros = (int64_t)result_sel;
          lower._0_8_ = cdata;
          upper.micros = count;
          upper.months = (int)in_stack_ffffffffffffff98;
          upper.days = (int)((ulong)in_stack_ffffffffffffff98 >> 0x20);
          bVar1 = UpperInclusiveBetweenOperator::Operation<duckdb::interval_t>(input,lower,upper);
          uVar2 = (ulong)!bVar1;
        }
      }
    }
    false_sel->sel_vector[lVar5] = (sel_t)uVar3;
    lVar5 = lVar5 + uVar2;
  }
  return count - lVar5;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}